

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.cc
# Opt level: O2

void __thiscall
xemmai::t_type_of<xemmai::t_fiber>::f_do_instantiate
          (t_type_of<xemmai::t_fiber> *this,t_pvalue *a_stack,size_t a_n)

{
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *paVar1;
  t_object *ptVar2;
  long in_FS_OFFSET;
  wstring_view a_message;
  
  if (a_n - 3 < 0xfffffffffffffffe) {
    a_message._M_str = L"must be called with 1 or 2 argument(s).";
    a_message._M_len = 0x27;
    f_throw(a_message);
  }
  if (a_n == 2) {
    f_check<unsigned_long>(a_stack[3].super_t_pointer.v_p,L"argument1");
    ptVar2 = a_stack[3].super_t_pointer.v_p;
    paVar1 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)ptVar2->v_data;
    if (ptVar2 < (t_object *)0x5) {
      paVar1 = &a_stack[3].field_0;
    }
  }
  else {
    paVar1 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)
             (*(long *)(in_FS_OFFSET + -0x60) + 0x4c8);
  }
  ptVar2 = t_fiber::f_instantiate(a_stack + 2,paVar1->v_integer);
  (a_stack->super_t_pointer).v_p = ptVar2;
  return;
}

Assistant:

void t_type_of<t_fiber>::f_do_instantiate(t_pvalue* a_stack, size_t a_n)
{
	if (a_n != 1 && a_n != 2) f_throw(L"must be called with 1 or 2 argument(s)."sv);
	auto size = f_engine()->v_options.v_stack_size;
	if (a_n == 2) {
		f_check<size_t>(a_stack[3], L"argument1");
		size = f_as<size_t>(a_stack[3]);
	}
	a_stack[0] = t_fiber::f_instantiate(a_stack[2], size);
}